

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxpool.h
# Opt level: O0

void __thiscall cxxpool::thread_pool::~thread_pool(thread_pool *this)

{
  int in_EDX;
  int in_ESI;
  thread_pool *this_local;
  
  shutdown(this,in_ESI,in_EDX);
  std::condition_variable::~condition_variable(&this->task_cond_var_);
  detail::infinite_counter<unsigned_long,_18446744073709551615UL>::~infinite_counter
            (&this->task_counter_);
  std::
  priority_queue<cxxpool::detail::priority_task,_std::vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>,_std::less<cxxpool::detail::priority_task>_>
  ::~priority_queue(&this->tasks_);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads_);
  return;
}

Assistant:

~thread_pool() {
        shutdown();
    }